

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_xfrm.c
# Opt level: O1

void easm_cfold_sinsn(easm_sinsn *sinsn)

{
  easm_operand *peVar1;
  long lVar2;
  long lVar3;
  
  if (0 < sinsn->operandsnum) {
    lVar2 = 0;
    do {
      peVar1 = sinsn->operands[lVar2];
      if (0 < peVar1->exprsnum) {
        lVar3 = 0;
        do {
          easm_cfold_expr(peVar1->exprs[lVar3]);
          lVar3 = lVar3 + 1;
          peVar1 = sinsn->operands[lVar2];
        } while (lVar3 < peVar1->exprsnum);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < sinsn->operandsnum);
  }
  return;
}

Assistant:

void easm_cfold_sinsn(struct easm_sinsn *sinsn) {
	int i, j;
	for (i = 0; i < sinsn->operandsnum; i++)
		for (j = 0; j < sinsn->operands[i]->exprsnum; j++)
			easm_cfold_expr(sinsn->operands[i]->exprs[j]);
}